

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fontstash.h
# Opt level: O0

void fonsPushState(FONScontext *stash)

{
  int iVar1;
  float fVar2;
  FONSstate *pFVar3;
  FONSstate *pFVar4;
  FONScontext *stash_local;
  
  if (stash->nstates < 0x14) {
    if (0 < stash->nstates) {
      pFVar3 = stash->states + stash->nstates;
      pFVar4 = stash->states + (stash->nstates + -1);
      iVar1 = pFVar4->align;
      pFVar3->font = pFVar4->font;
      pFVar3->align = iVar1;
      iVar1 = pFVar4->blurType;
      pFVar3->size = pFVar4->size;
      pFVar3->blurType = iVar1;
      fVar2 = pFVar4->blur;
      pFVar3->color = pFVar4->color;
      pFVar3->blur = fVar2;
      iVar1 = pFVar4->useShaping;
      pFVar3->spacing = pFVar4->spacing;
      pFVar3->useShaping = iVar1;
    }
    stash->nstates = stash->nstates + 1;
  }
  else if (stash->handleError != (_func_void_void_ptr_int_int *)0x0) {
    (*stash->handleError)(stash->errorUptr,3,0);
  }
  return;
}

Assistant:

void fonsPushState(FONScontext* stash) {
    if (stash->nstates >= FONS_MAX_STATES) {
        if (stash->handleError)
            stash->handleError(stash->errorUptr, FONS_STATES_OVERFLOW, 0);
        return;
    }
    if (stash->nstates > 0)
        memcpy(&stash->states[stash->nstates], &stash->states[stash->nstates-1], sizeof(FONSstate));
    stash->nstates++;
}